

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sign.c
# Opt level: O0

void print_test_result(int err)

{
  int in_EDI;
  
  if (in_EDI == 1) {
    printf("\x1b[1;32msuccess\x1b[m\n");
  }
  else if (in_EDI == 0) {
    printf("\x1b[1;31mfailure\x1b[m\n");
  }
  else {
    ERR_print_errors_fp(_stderr);
  }
  return;
}

Assistant:

static void print_test_result(int err)
{
    if (err == 1)
	printf(cGREEN "success" cNORM "\n");
    else if (err == 0)
	printf(cRED "failure" cNORM "\n");
    else
	ERR_print_errors_fp(stderr);
}